

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O3

void __thiscall
QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>::Holder
          (Holder<(anonymous_namespace)::Q_QGS_tzZones> *this)

{
  QByteArrayView view;
  QObjectData *data;
  QObjectData *pQVar1;
  bool bVar2;
  Territory TVar3;
  int iVar4;
  void *pvVar5;
  ulong uVar6;
  qsizetype qVar7;
  Node<QByteArray,_QTzTimeZone> *pNVar8;
  QObjectData *in_RCX;
  QObjectData *pQVar9;
  int __oflag;
  __off_t __length;
  undefined1 *size;
  uint uVar10;
  ulong uVar11;
  char *b;
  char *pcVar12;
  size_t __n;
  size_t sVar13;
  QChar *data_00;
  long in_FS_OFFSET;
  QStringView code;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QByteArrayView ba;
  QLatin1StringView rhs;
  QLatin1StringView rhs_00;
  QByteArrayView QVar14;
  QStringView lhs;
  QStringView lhs_00;
  const_iterator __begin1;
  QObjectData *pQVar15;
  undefined1 data_01 [8];
  QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> QStack_170;
  QObjectData *local_168;
  QByteArray local_158;
  QString local_138;
  QString local_118;
  DirEntry local_f8;
  QDirListing local_f0;
  QString local_e8;
  QByteArray local_c8;
  undefined1 local_a8 [8];
  QObjectData *pQStack_a0;
  QObjectData *local_98;
  QObjectData *pQStack_90;
  QByteArray local_88;
  QFile local_68;
  char *local_50;
  QFile local_48;
  long local_38;
  storage_type_conflict *extraout_RDX;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_68.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
       (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile(&local_68);
  QVar14.m_data = (storage_type *)in_RCX;
  QVar14.m_size = (qsizetype)"zone.tab";
  QString::fromLatin1((QString *)local_a8,(QString *)0x8,QVar14);
  QStack_170.d = pQStack_a0;
  local_168 = local_98;
  data_01 = local_a8;
  bVar2 = openZoneInfo((QString *)&stack0xfffffffffffffe88,&local_68);
  ba.m_data = in_RCX;
  if (data_01 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)&((QObjectData *)data_01)->_vptr_QObjectData)->_q_value).
    super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&((QObjectData *)data_01)->_vptr_QObjectData)->_q_value).
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&((QObjectData *)data_01)->_vptr_QObjectData)->_q_value).
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)data_01,2,0x10);
      ba.m_data = in_RCX;
    }
  }
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>>::instance()::holder =
       (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)0x0;
  if (bVar2) {
    local_88.d.d = (Data *)0x0;
    local_88.d.ptr = (char *)0x0;
    local_88.d.size = 0;
    while (pQVar9 = local_168, bVar2 = QIODevice::readLineInto((QIODevice *)&local_68,&local_88,0),
          bVar2) {
      view.m_data = (storage_type *)data_01;
      view.m_size = 0x3ffcb9;
      QVar14 = QtPrivate::trimmed(view);
      ba.m_size = QVar14.m_data;
      sVar13 = QVar14.m_size;
      if (((sVar13 != 0) && (0 < (long)sVar13)) && (*ba.m_size != '#')) {
        pvVar5 = memchr(ba.m_size,9,sVar13);
        uVar10 = (int)pvVar5 - (int)QVar14.m_data;
        ba.m_data = (QObjectData *)
                    CONCAT71((int7)((ulong)ba.m_data >> 8),0 < (int)uVar10 && pvVar5 != (void *)0x0)
        ;
        if (0 < (int)uVar10 && pvVar5 != (void *)0x0) {
          local_a8 = (undefined1  [8])0xaaaaaaaaaaaa0000;
          pQStack_a0 = (QObjectData *)0x0;
          local_98 = (QObjectData *)0x0;
          pQStack_90 = (QObjectData *)0x0;
          QString::fromUtf8((QString *)&stack0xfffffffffffffe88,
                            (QString *)(ulong)(uVar10 & 0x7fffffff),ba);
          code.m_data = extraout_RDX;
          code.m_size = (qsizetype)QStack_170.d;
          TVar3 = QLocalePrivate::codeToTerritory((QLocalePrivate *)local_168,code);
          local_a8._0_2_ = TVar3;
          if (data_01 != (undefined1  [8])0x0) {
            LOCK();
            (((QBasicAtomicInt *)&((QObjectData *)data_01)->_vptr_QObjectData)->_q_value).
            super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&((QObjectData *)data_01)->_vptr_QObjectData)->_q_value).
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&((QObjectData *)data_01)->_vptr_QObjectData)->_q_value).
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)data_01,2,0x10);
            }
          }
          uVar6 = (ulong)(uVar10 + 1);
          __n = sVar13 - uVar6;
          if (__n != 0 && (long)uVar6 <= (long)sVar13) {
            pcVar12 = ba.m_size + uVar6;
            pvVar5 = memchr(pcVar12,9,__n);
            ba.m_data = (QObjectData *)CONCAT71((int7)((ulong)ba.m_data >> 8),pvVar5 != (void *)0x0)
            ;
            iVar4 = (int)pvVar5 - (int)pcVar12;
            if (-1 < iVar4 && pvVar5 != (void *)0x0) {
              uVar6 = (ulong)(iVar4 + 1);
              pcVar12 = pcVar12 + uVar6;
              sVar13 = __n - uVar6;
              if ((sVar13 == 0 || (long)__n < (long)uVar6) ||
                 (pvVar5 = memchr(pcVar12,9,sVar13), pvVar5 == (void *)0x0)) {
                bVar2 = false;
                uVar11 = 0;
                uVar6 = sVar13;
                pQVar15 = (QObjectData *)data_01;
              }
              else {
                uVar10 = (int)pvVar5 - (int)pcVar12;
                if (uVar10 == 0) goto LAB_003ffea8;
                bVar2 = 0 < (int)uVar10;
                uVar6 = (ulong)(uVar10 & 0x7fffffff);
                if ((int)uVar10 < 1) {
                  uVar6 = sVar13;
                }
                uVar11 = (ulong)(uVar10 + 1);
                pQVar15 = (QObjectData *)data_01;
              }
              local_c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_c8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
              QByteArray::QByteArray(&local_c8,pcVar12,uVar6);
              data_01 = (undefined1  [8])pQVar15;
              pQVar1 = pQStack_a0;
              if (bVar2) {
                QByteArray::QByteArray
                          ((QByteArray *)&stack0xfffffffffffffe88,pcVar12 + uVar11,sVar13 - uVar11);
                ba.m_data = local_98;
                data = pQStack_a0;
                local_98 = QStack_170.d;
                QStack_170.d = ba.m_data;
                local_168 = pQStack_90;
                pQStack_90 = pQVar9;
                ba.m_data = pQVar9;
                data_01 = (undefined1  [8])pQStack_a0;
                pQVar1 = pQVar15;
                if (pQStack_a0 != (QObjectData *)0x0) {
                  LOCK();
                  *(int *)&pQStack_a0->_vptr_QObjectData =
                       *(int *)&pQStack_a0->_vptr_QObjectData + -1;
                  UNLOCK();
                  if (*(int *)&pQStack_a0->_vptr_QObjectData == 0) {
                    pQStack_a0 = pQVar15;
                    QArrayData::deallocate((QArrayData *)data,1,0x10);
                    ba.m_data = pQVar9;
                    pQVar1 = pQStack_a0;
                  }
                }
              }
              pQStack_a0 = pQVar1;
              QHash<QByteArray,QTzTimeZone>::emplace<QTzTimeZone_const&>
                        ((QHash<QByteArray,QTzTimeZone> *)
                         &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>>
                          ::instance()::holder,&local_c8,(QTzTimeZone *)local_a8);
              QtGlobalStatic::Holder((QtGlobalStatic *)&local_c8);
            }
          }
LAB_003ffea8:
          QtGlobalStatic::Holder((QtGlobalStatic *)&pQStack_a0);
        }
      }
    }
    local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFile::fileName(&local_e8,&local_68);
    pcVar12 = (char *)0x1;
    qVar7 = QString::lastIndexOf(&local_e8,(QChar)0x2f,-1,CaseSensitive);
    QString::truncate(&local_e8,(char *)(qVar7 + 1),__length);
    qVar7 = local_e8.d.size;
    QDirListing::QDirListing(&local_f0,&local_e8,(IteratorFlags)0x400);
    local_f8.dirListPtr = (QDirListingPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_f8.dirListPtr = (QDirListingPrivate *)QDirListing::begin(&local_f0);
    for (; local_f8.dirListPtr != (QDirListingPrivate *)0x0; local_f8 = QDirListing::next(local_f8))
    {
      bVar2 = QDirListing::DirEntry::isFile(&local_f8);
      if ((bVar2) || (bVar2 = QDirListing::DirEntry::isSymLink(&local_f8), bVar2)) {
        local_118.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_118.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_118.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QDirListing::DirEntry::absoluteFilePath(&local_118,&local_f8);
        local_138.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_138.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_138.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QString::QString(&local_138,(QChar *)(local_118.d.ptr + qVar7),local_118.d.size - qVar7);
        bVar2 = QDirListing::DirEntry::isDir(&local_f8);
        data_00 = (QChar *)local_138.d.ptr;
        if (bVar2) {
          size = (undefined1 *)local_138.d.size;
          if ((undefined1 *)local_138.d.size == (undefined1 *)0x5) {
            rhs.m_data = "posix";
            rhs.m_size = 5;
            pcVar12 = "posix";
            lhs.m_data = local_138.d.ptr;
            lhs.m_size = 5;
            bVar2 = QtPrivate::equalStrings(lhs,rhs);
            if (!bVar2) {
              size = (undefined1 *)0x5;
              rhs_00.m_data = "right";
              rhs_00.m_size = 5;
              pcVar12 = "right";
              lhs_00.m_data = &data_00->ucs;
              lhs_00.m_size = 5;
              bVar2 = QtPrivate::equalStrings(lhs_00,rhs_00);
              goto joined_r0x00400087;
            }
          }
          else {
LAB_00400097:
            local_158.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_158.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_158.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
            QString::toLocal8Bit_helper(&local_158,data_00,(qsizetype)size);
            if ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>>::
                 instance()::holder == (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)0x0) ||
               (pNVar8 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_>::
                         findNode<QByteArray>
                                   (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>>
                                    ::instance()::holder,&local_158),
               pNVar8 == (Node<QByteArray,_QTzTimeZone> *)0x0)) {
              local_48.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
                   (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
              local_48.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
                   (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
              QFile::QFile(&local_48,&local_118);
              iVar4 = QFile::open(&local_48,(char *)0x1,__oflag);
              if ((char)iVar4 == '\0') {
                QFile::~QFile(&local_48);
              }
              else {
                QIODevice::read((QIODevice *)&stack0xfffffffffffffe88,(int)&local_48,(void *)0x4,
                                (size_t)pcVar12);
                local_50 = "TZif";
                bVar2 = ::operator==((QByteArray *)&stack0xfffffffffffffe88,&local_50);
                if (data_01 != (undefined1  [8])0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)&((QObjectData *)data_01)->_vptr_QObjectData)->_q_value).
                  super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)&((QObjectData *)data_01)->_vptr_QObjectData)->_q_value)
                       .super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)&((QObjectData *)data_01)->_vptr_QObjectData)->_q_value).
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate((QArrayData *)data_01,1,0x10);
                  }
                }
                QFile::~QFile(&local_48);
                if (bVar2) {
                  data_01 = (undefined1  [8])0x0;
                  QHash<QByteArray,QTzTimeZone>::emplace<QTzTimeZone_const&>
                            ((QHash<QByteArray,QTzTimeZone> *)
                             &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>>
                              ::instance()::holder,&local_158,
                             (QTzTimeZone *)&stack0xfffffffffffffe88);
                }
              }
            }
            if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,1,0x10);
              }
            }
          }
        }
        else {
          pcVar12 = (char *)0x1;
          s.m_data = "posix/";
          s.m_size = 6;
          bVar2 = QString::startsWith(&local_138,s,CaseSensitive);
          if (!bVar2) {
            pcVar12 = (char *)0x1;
            s_00.m_data = "right/";
            s_00.m_size = 6;
            bVar2 = QString::startsWith(&local_138,s_00,CaseSensitive);
            data_00 = (QChar *)local_138.d.ptr;
            size = (undefined1 *)local_138.d.size;
joined_r0x00400087:
            if (!bVar2) goto LAB_00400097;
          }
        }
        if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    QDirListing::~QDirListing(&local_f0);
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  QFile::~QFile(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Holder() noexcept(ConstructionIsNoexcept)
    {
        QGS::innerFunction(pointer());
        guard.storeRelaxed(QtGlobalStatic::Initialized);
    }